

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

int llvm::APInt::tcMultiplyPart
              (WordType *dst,WordType *src,WordType multiplier,WordType carry,uint srcParts,
              uint dstParts,bool add)

{
  WordType *pWVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint i;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar8 = (ulong)srcParts;
  if (dst < src + uVar8 && src < dst) {
    __assert_fail("dst <= src || dst >= src + srcParts",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x957,
                  "static int llvm::APInt::tcMultiplyPart(WordType *, const WordType *, WordType, WordType, unsigned int, unsigned int, bool)"
                 );
  }
  if (srcParts + 1 < dstParts) {
    __assert_fail("dstParts <= srcParts + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x958,
                  "static int llvm::APInt::tcMultiplyPart(WordType *, const WordType *, WordType, WordType, unsigned int, unsigned int, bool)"
                 );
  }
  uVar6 = (ulong)dstParts;
  if (srcParts < dstParts) {
    uVar6 = (ulong)srcParts;
  }
  for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
    if ((multiplier == 0) || (uVar2 = src[uVar9], uVar2 == 0)) {
      uVar5 = carry;
      carry = 0;
    }
    else {
      uVar4 = (uVar2 & 0xffffffff) * (multiplier & 0xffffffff);
      uVar10 = (uVar2 & 0xffffffff) * (multiplier >> 0x20);
      uVar7 = (uVar2 >> 0x20) * (multiplier & 0xffffffff);
      uVar11 = ((ulong)(uint)((int)uVar10 + (int)uVar7) << 0x20) + uVar4;
      uVar5 = carry + uVar11;
      carry = (ulong)(uVar11 < (uVar10 << 0x20) + uVar4) +
              (uVar7 >> 0x20) + (uVar10 >> 0x20) + (uVar2 >> 0x20) * (multiplier >> 0x20) +
              (ulong)CARRY8(uVar10 << 0x20,uVar4) + (ulong)CARRY8(carry,uVar11);
    }
    if (add) {
      bVar12 = CARRY8(uVar5,dst[uVar9]);
      uVar5 = uVar5 + dst[uVar9];
      carry = carry + bVar12;
    }
    dst[uVar9] = uVar5;
  }
  if (srcParts < dstParts) {
    if (srcParts + 1 != dstParts) {
      __assert_fail("srcParts + 1 == dstParts",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x992,
                    "static int llvm::APInt::tcMultiplyPart(WordType *, const WordType *, WordType, WordType, unsigned int, unsigned int, bool)"
                   );
    }
    dst[uVar8] = carry;
LAB_0015db4c:
    uVar3 = 0;
  }
  else if (multiplier == 0 || carry != 0) {
    uVar3 = (uint)(carry != 0);
  }
  else {
    uVar6 = (ulong)dstParts;
    uVar3 = 1;
    do {
      if (uVar8 == uVar6) goto LAB_0015db4c;
      pWVar1 = src + uVar6;
      uVar6 = uVar6 + 1;
    } while (*pWVar1 == 0);
  }
  return uVar3;
}

Assistant:

int APInt::tcMultiplyPart(WordType *dst, const WordType *src,
                          WordType multiplier, WordType carry,
                          unsigned srcParts, unsigned dstParts,
                          bool add) {
  /* Otherwise our writes of DST kill our later reads of SRC.  */
  assert(dst <= src || dst >= src + srcParts);
  assert(dstParts <= srcParts + 1);

  /* N loops; minimum of dstParts and srcParts.  */
  unsigned n = std::min(dstParts, srcParts);

  for (unsigned i = 0; i < n; i++) {
    WordType low, mid, high, srcPart;

      /* [ LOW, HIGH ] = MULTIPLIER * SRC[i] + DST[i] + CARRY.

         This cannot overflow, because

         (n - 1) * (n - 1) + 2 (n - 1) = (n - 1) * (n + 1)

         which is less than n^2.  */

    srcPart = src[i];

    if (multiplier == 0 || srcPart == 0) {
      low = carry;
      high = 0;
    } else {
      low = lowHalf(srcPart) * lowHalf(multiplier);
      high = highHalf(srcPart) * highHalf(multiplier);

      mid = lowHalf(srcPart) * highHalf(multiplier);
      high += highHalf(mid);
      mid <<= APINT_BITS_PER_WORD / 2;
      if (low + mid < low)
        high++;
      low += mid;

      mid = highHalf(srcPart) * lowHalf(multiplier);
      high += highHalf(mid);
      mid <<= APINT_BITS_PER_WORD / 2;
      if (low + mid < low)
        high++;
      low += mid;

      /* Now add carry.  */
      if (low + carry < low)
        high++;
      low += carry;
    }

    if (add) {
      /* And now DST[i], and store the new low part there.  */
      if (low + dst[i] < low)
        high++;
      dst[i] += low;
    } else
      dst[i] = low;

    carry = high;
  }

  if (srcParts < dstParts) {
    /* Full multiplication, there is no overflow.  */
    assert(srcParts + 1 == dstParts);
    dst[srcParts] = carry;
    return 0;
  }

  /* We overflowed if there is carry.  */
  if (carry)
    return 1;

  /* We would overflow if any significant unwritten parts would be
     non-zero.  This is true if any remaining src parts are non-zero
     and the multiplier is non-zero.  */
  if (multiplier)
    for (unsigned i = dstParts; i < srcParts; i++)
      if (src[i])
        return 1;

  /* We fitted in the narrow destination.  */
  return 0;
}